

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O2

StructValues<wasm::(anonymous_namespace)::Bool> * __thiscall
wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>::operator[]
          (StructValuesMap<wasm::(anonymous_namespace)::Bool> *this,HeapType type)

{
  __node_base *p_Var1;
  size_type *psVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base _Var4;
  _Hash_node_base *p_Var5;
  _Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
  *this_00;
  bool bVar6;
  Bool *__cur;
  pointer pBVar7;
  size_t sVar8;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var9;
  Struct *pSVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  long lVar13;
  ulong uVar14;
  size_type __n;
  _Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
  *this_01;
  _Hash_node_base _Var15;
  __node_ptr p_Var16;
  ulong uVar17;
  _Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
  *heapType;
  ulong uVar18;
  undefined1 auVar19 [16];
  _Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
  local_98;
  _Hash_node_base *local_80;
  _Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
  local_78;
  __node_ptr local_60;
  size_t local_58;
  _Scoped_node local_50;
  _Hash_node_base local_40;
  HeapType type_local;
  __buckets_alloc_type __alloc;
  
  local_40._M_nxt = (_Hash_node_base *)type.id;
  bVar6 = HeapType::isStruct((HeapType *)&local_40);
  _Var15._M_nxt = local_40._M_nxt;
  if (!bVar6) {
    __assert_fail("type.isStruct()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/struct-utils.h"
                  ,0x3a,
                  "StructValues<T> &wasm::StructUtils::StructValuesMap<wasm::(anonymous namespace)::Bool>::operator[](HeapType) [T = wasm::(anonymous namespace)::Bool]"
                 );
  }
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80 = local_40._M_nxt;
  pBVar7 = std::
           _Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
           ::_M_allocate((_Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
                          *)0x0,type.id);
  local_78._M_impl.super__Vector_impl_data._M_start = pBVar7;
  local_78._M_impl.super__Vector_impl_data._M_finish = pBVar7;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = pBVar7;
  local_50._M_h = (__hashtable_alloc *)this;
  local_60 = (__node_ptr)operator_new(0x30);
  (local_60->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  heapType = &local_60->
              super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
  ;
  (local_60->
  super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
  ._M_storage._M_storage.__align = (anon_struct_8_0_00000001_for___align)_Var15._M_nxt;
  *(pointer *)
   ((long)&(local_60->
           super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
           ._M_storage._M_storage + 8) = pBVar7;
  *(pointer *)
   ((long)&(local_60->
           super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
           ._M_storage._M_storage + 0x10) = pBVar7;
  *(pointer *)
   ((long)&(local_60->
           super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
           ._M_storage._M_storage + 0x18) = pBVar7;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50._M_node = local_60;
  sVar8 = std::hash<wasm::HeapType>::operator()((hash<wasm::HeapType> *)this,(HeapType *)heapType);
  _Var15._M_nxt =
       (_Hash_node_base *)
       (this->
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
       )._M_h._M_bucket_count;
  uVar14 = sVar8 % (ulong)_Var15._M_nxt;
  p_Var3 = (this->
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
           )._M_h._M_buckets[uVar14];
  if (p_Var3 != (__node_base_ptr)0x0) {
    p_Var16 = (__node_ptr)p_Var3->_M_nxt;
    uVar17 = (p_Var16->
             super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
             ).super__Hash_node_code_cache<true>._M_hash_code;
    do {
      if ((uVar17 == sVar8) &&
         ((heapType->
          super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
          )._M_storage._M_storage.__align ==
          (p_Var16->
          super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
          ).
          super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
          ._M_storage._M_storage.__align)) {
        bVar6 = false;
        goto LAB_009b11b5;
      }
      p_Var16 = (__node_ptr)(p_Var16->super__Hash_node_base)._M_nxt;
    } while ((p_Var16 != (__node_ptr)0x0) &&
            (uVar17 = (p_Var16->
                      super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
                      ).super__Hash_node_code_cache<true>._M_hash_code,
            uVar17 % (ulong)_Var15._M_nxt == uVar14));
  }
  local_58 = (this->
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
             )._M_h._M_rehash_policy._M_next_resize;
  auVar19 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                      ((ulong)&(this->
                               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                               )._M_h._M_rehash_policy,(ulong)_Var15._M_nxt,
                       (this->
                       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                       )._M_h._M_element_count);
  __n = auVar19._8_8_;
  if ((auVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __s = (this->
          super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
          )._M_h._M_buckets;
  }
  else {
    if (__n == 1) {
      __s = &(this->
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
             )._M_h._M_single_bucket;
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
      )._M_h._M_single_bucket = (__node_base_ptr)0x0;
    }
    else {
      __s = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::allocate
                      ((allocator_type *)((long)&type_local.id + 7),__n);
      memset(__s,0,__n * 8);
    }
    p_Var1 = &(this->
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
              )._M_h._M_before_begin;
    _Var4._M_nxt = (this->
                   super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                   )._M_h._M_before_begin._M_nxt;
    (this->
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
    )._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    uVar14 = 0;
LAB_009b10d6:
    _Var15._M_nxt = _Var4._M_nxt;
    uVar17 = uVar14;
    if (_Var15._M_nxt != (_Hash_node_base *)0x0) {
      _Var4._M_nxt = (_Var15._M_nxt)->_M_nxt;
      uVar14 = (ulong)_Var15._M_nxt[5]._M_nxt % __n;
      if (__s[uVar14] == (_Hash_node_base *)0x0) goto LAB_009b1107;
      (_Var15._M_nxt)->_M_nxt = __s[uVar14]->_M_nxt;
      pp_Var9 = &__s[uVar14]->_M_nxt;
      uVar14 = uVar17;
      goto LAB_009b1126;
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_deallocate_buckets
              ((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)this);
    (this->
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
    )._M_h._M_bucket_count = __n;
    (this->
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
    )._M_h._M_buckets = __s;
    uVar14 = sVar8 % __n;
  }
  (local_60->
  super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
  ).super__Hash_node_code_cache<true>._M_hash_code = sVar8;
  if (__s[uVar14] == (_Hash_node_base *)0x0) {
    p_Var5 = (this->
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
             )._M_h._M_before_begin._M_nxt;
    (local_60->super__Hash_node_base)._M_nxt = p_Var5;
    (this->
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
    )._M_h._M_before_begin._M_nxt = &local_60->super__Hash_node_base;
    if (p_Var5 != (_Hash_node_base *)0x0) {
      __s[(ulong)p_Var5[5]._M_nxt %
          (this->
          super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
          )._M_h._M_bucket_count] = &local_60->super__Hash_node_base;
      __s = (this->
            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
            )._M_h._M_buckets;
    }
    __s[uVar14] = &(this->
                   super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                   )._M_h._M_before_begin;
  }
  else {
    (local_60->super__Hash_node_base)._M_nxt = __s[uVar14]->_M_nxt;
    __s[uVar14]->_M_nxt = &local_60->super__Hash_node_base;
  }
  psVar2 = &(this->
            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
            )._M_h._M_element_count;
  *psVar2 = *psVar2 + 1;
  local_50._M_node = (__node_ptr)0x0;
  bVar6 = true;
  p_Var16 = local_60;
LAB_009b11b5:
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_50);
  std::
  _Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
  ::~_Vector_base(&local_78);
  std::
  _Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
  ::~_Vector_base(&local_98);
  if (bVar6) {
    pSVar10 = HeapType::getStruct((HeapType *)&local_40);
    uVar18 = (long)(pSVar10->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pSVar10->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
    lVar13 = *(long *)((long)&(p_Var16->
                              super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
                              ._M_storage._M_storage + 8);
    puVar11 = *(undefined1 **)
               ((long)&(p_Var16->
                       super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
                       ._M_storage._M_storage + 0x10);
    uVar17 = (long)puVar11 - lVar13;
    uVar14 = uVar18 - uVar17;
    if (uVar18 < uVar17 || uVar14 == 0) {
      if ((uVar18 < uVar17) && (puVar12 = (undefined1 *)(lVar13 + uVar18), puVar11 != puVar12)) {
        *(undefined1 **)
         ((long)&(p_Var16->
                 super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
                 ._M_storage._M_storage + 0x10) = puVar12;
      }
    }
    else if (uVar14 != 0) {
      if ((ulong)(*(long *)((long)&(p_Var16->
                                   super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
                                   ._M_storage._M_storage + 0x18) - (long)puVar11) < uVar14) {
        if ((uVar17 ^ 0x7fffffffffffffff) < uVar14) {
          std::__throw_length_error("vector::_M_default_append");
        }
        if (uVar14 < uVar17) {
          uVar14 = uVar17;
        }
        this_01 = (_Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
                   *)(uVar14 + uVar17);
        if ((_Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
             *)0x7ffffffffffffffe < this_01) {
          this_01 = (_Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
                     *)0x7fffffffffffffff;
        }
        pBVar7 = std::
                 _Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
                 ::_M_allocate(this_01,(size_t)_Var15._M_nxt);
        for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
          pBVar7[uVar17].value = false;
        }
        this_00 = *(_Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
                    **)((long)&(p_Var16->
                               super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
                               ._M_storage._M_storage + 8);
        puVar11 = *(undefined1 **)
                   ((long)&(p_Var16->
                           super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
                           ._M_storage._M_storage + 0x10);
        for (lVar13 = 0;
            puVar12 = (undefined1 *)
                      ((long)&(this_00->_M_impl).super__Vector_impl_data._M_start + lVar13),
            puVar12 != puVar11; lVar13 = lVar13 + 1) {
          pBVar7[lVar13].value = (bool)*puVar12;
        }
        std::
        _Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
        ::_M_deallocate(this_00,(pointer)(*(long *)((long)&(p_Var16->
                                                                                                                      
                                                  super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
                                                  ._M_storage._M_storage + 0x18) - (long)this_00),
                        (size_t)puVar12);
        *(pointer *)
         ((long)&(p_Var16->
                 super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
                 ._M_storage._M_storage + 8) = pBVar7;
        *(pointer *)
         ((long)&(p_Var16->
                 super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
                 ._M_storage._M_storage + 0x10) = pBVar7 + uVar18;
        *(pointer *)
         ((long)&(p_Var16->
                 super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
                 ._M_storage._M_storage + 0x18) = pBVar7 + (long)&this_01->_M_impl;
      }
      else {
        while (bVar6 = uVar14 != 0, uVar14 = uVar14 - 1, bVar6) {
          *puVar11 = 0;
          puVar11 = puVar11 + 1;
        }
        *(undefined1 **)
         ((long)&(p_Var16->
                 super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
                 ._M_storage._M_storage + 0x10) = puVar11;
      }
    }
  }
  return (StructValues<wasm::(anonymous_namespace)::Bool> *)
         ((long)&(p_Var16->
                 super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>
                 ._M_storage._M_storage + 8);
LAB_009b1107:
  (_Var15._M_nxt)->_M_nxt = p_Var1->_M_nxt;
  p_Var1->_M_nxt = _Var15._M_nxt;
  __s[uVar14] = p_Var1;
  if ((_Var15._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var9 = __s + uVar17;
LAB_009b1126:
    *pp_Var9 = _Var15._M_nxt;
  }
  goto LAB_009b10d6;
}

Assistant:

StructValues<T>& operator[](HeapType type) {
    assert(type.isStruct());
    auto inserted = this->insert({type, {}});
    auto& values = inserted.first->second;
    if (inserted.second) {
      values.resize(type.getStruct().fields.size());
    }
    return values;
  }